

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O0

void __thiscall TorController::connected_cb(TorController *this,TorControlConnection *_conn)

{
  undefined1 uVar1;
  byte bVar2;
  string *in_RSI;
  ReplyHandlerCB *in_RDI;
  long in_FS_OFFSET;
  Level in_stack_000000a0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  _Placeholder<1> *in_stack_ffffffffffffff00;
  TorController **in_stack_ffffffffffffff08;
  _Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>
  *in_stack_ffffffffffffff10;
  undefined6 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  TorControlConnection *this_00;
  allocator<char> *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  LogFlags in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  ConstevalFormatString<0U> in_stack_ffffffffffffffa8;
  string_view in_stack_ffffffffffffffb0;
  string_view in_stack_ffffffffffffffc0;
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)&in_RDI[9]._M_invoker = 0x3f800000;
  this_00 = (TorControlConnection *)&stack0xffffffffffffffd7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::
  bind<void(TorController::*)(TorControlConnection&,TorControlReply_const&),TorController*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            (&in_stack_ffffffffffffff10->_M_f,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             (_Placeholder<2> *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::function<void(TorControlConnection&,TorControlReply_const&)>::
  function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>,std::_Placeholder<2>))(TorControlConnection&,TorControlReply_const&)>,void>
            ((function<void_(TorControlConnection_&,_const_TorControlReply_&)> *)
             CONCAT17(in_stack_ffffffffffffff1f,
                      CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18)),
             in_stack_ffffffffffffff10);
  uVar1 = TorControlConnection::Command(this_00,in_RSI,in_RDI);
  bVar2 = uVar1 ^ 0xff;
  std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>::~function
            ((function<void_(TorControlConnection_&,_const_TorControlReply_&)> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  if ((bVar2 & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(uVar1,CONCAT16(bVar2,in_stack_ffffffffffffff18)),
               (char *)in_stack_ffffffffffffff10);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(uVar1,CONCAT16(bVar2,in_stack_ffffffffffffff18)),
               (char *)in_stack_ffffffffffffff10);
    LogPrintFormatInternal<>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb0,in_stack_ffffffffffffff6c,
               in_stack_ffffffffffffff60,in_stack_000000a0,in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TorController::connected_cb(TorControlConnection& _conn)
{
    reconnect_timeout = RECONNECT_TIMEOUT_START;
    // First send a PROTOCOLINFO command to figure out what authentication is expected
    if (!_conn.Command("PROTOCOLINFO 1", std::bind(&TorController::protocolinfo_cb, this, std::placeholders::_1, std::placeholders::_2)))
        LogPrintf("tor: Error sending initial protocolinfo command\n");
}